

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_dict_begin(emitter_t *emitter,char *json_key,char *table_header)

{
  char *in_RDX;
  emitter_t *in_RSI;
  int *in_RDI;
  
  if (*in_RDI == 0) {
    emitter_json_key(in_RSI,in_RDX);
    emitter_json_object_begin((emitter_t *)0x25b9b5);
  }
  else {
    emitter_table_dict_begin(in_RSI,in_RDX);
  }
  return;
}

Assistant:

static inline void
emitter_dict_begin(emitter_t *emitter, const char *json_key,
    const char *table_header) {
	if (emitter->output == emitter_output_json) {
		emitter_json_key(emitter, json_key);
		emitter_json_object_begin(emitter);
	} else {
		emitter_table_dict_begin(emitter, table_header);
	}
}